

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int luaH_next(lua_State *L,Table *t,StkId key)

{
  byte bVar1;
  uint asize_00;
  Node *pNVar2;
  TValue *io2;
  TValue *io1;
  Node *n_;
  TValue *io_;
  Node *n;
  TValue *io;
  uint local_30;
  lu_byte tag;
  uint i;
  uint asize;
  StkId key_local;
  Table *t_local;
  lua_State *L_local;
  
  asize_00 = t->asize;
  for (local_30 = findindex(L,t,&key->val,asize_00); local_30 < asize_00; local_30 = local_30 + 1) {
    bVar1 = *(byte *)((long)t->array + (ulong)local_30 + 4);
    if ((bVar1 & 0xf) != 0) {
      *(long *)key = (long)(int)(local_30 + 1);
      (key->val).tt_ = '\x03';
      *(byte *)((long)key + 0x18) = bVar1;
      key[1].val.value_ = t->array[-1 - (ulong)local_30];
      return 1;
    }
  }
  local_30 = local_30 - asize_00;
  while( true ) {
    if ((uint)(1 << (t->lsizenode & 0x1f)) <= local_30) {
      return 0;
    }
    if (((&t->node->u)[local_30].tt_ & 0xf) != 0) break;
    local_30 = local_30 + 1;
  }
  pNVar2 = t->node + local_30;
  (key->val).value_ = (pNVar2->u).key_val;
  (key->val).tt_ = (pNVar2->u).key_tt;
  key[1].val.value_ = (pNVar2->u).value_;
  *(lu_byte *)((long)key + 0x18) = (pNVar2->u).tt_;
  return 1;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = t->asize;
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    lu_byte tag = *getArrTag(t, i);
    if (!tagisempty(tag)) {  /* a non-empty entry? */
      setivalue(s2v(key), cast_int(i) + 1);
      farr2val(t, i, tag, s2v(key + 1));
      return 1;
    }
  }
  for (i -= asize; i < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}